

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

unit_data __thiscall units::detail::unit_data::clear_per_unit(unit_data *this)

{
  unit_data uVar1;
  undefined8 in_RAX;
  unit_data local_34;
  
  local_34 = SUB84((ulong)in_RAX >> 0x20,0);
  uVar1 = *this;
  unit_data(&local_34,((int)uVar1 << 0x1c) >> 0x1c,((int)uVar1 << 0x15) >> 0x1d,
            (int)uVar1._0_1_ >> 4,((int)uVar1 << 0x12) >> 0x1d,((int)uVar1 << 0xd) >> 0x1d,
            ((int)uVar1 << 0xb) >> 0x1e,(int)uVar1._0_2_ >> 0xe,((int)uVar1 << 6) >> 0x1e,
            ((int)uVar1 << 4) >> 0x1e,((int)uVar1 << 8) >> 0x1d,0,(uint)uVar1 >> 0x1d & 1,
            (uint)uVar1 >> 0x1e & 1,(uint)uVar1 >> 0x1f);
  return local_34;
}

Assistant:

constexpr unit_data clear_per_unit() const
        {
            return {
                meter_,
                kilogram_,
                second_,
                ampere_,
                kelvin_,
                mole_,
                candela_,
                currency_,
                count_,
                radians_,
                0U,
                i_flag_,
                e_flag_,
                equation_};
        }